

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O1

INCREMENT_TYPE __thiscall
duckdb::RangeInfoStruct<duckdb::TimestampRangeInfo,_false>::ListIncrementValue
          (RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *this,idx_t row_idx)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  interval_t iVar3;
  INCREMENT_TYPE IVar4;
  INCREMENT_TYPE IVar5;
  undefined1 auVar6 [12];
  int64_t iVar7;
  
  if ((ulong)(((long)(this->args->data).
                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->args->data).
                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5) < 3) {
    iVar3 = TimestampRangeInfo::DefaultIncrement();
    IVar4.months = iVar3.months;
    auVar6._4_4_ = iVar3.days;
    register0x00000010 = iVar3.micros;
    return IVar4;
  }
  pdVar1 = this->vdata[2].data;
  psVar2 = (this->vdata[2].sel)->sel_vector;
  if (psVar2 != (sel_t *)0x0) {
    row_idx = (idx_t)psVar2[row_idx];
  }
  IVar5.micros = *(int64_t *)(pdVar1 + row_idx * 0x10 + 8);
  IVar5._0_8_ = *(undefined8 *)(pdVar1 + row_idx * 0x10);
  return IVar5;
}

Assistant:

typename OP::INCREMENT_TYPE ListIncrementValue(idx_t row_idx) {
		if (args.ColumnCount() < 3) {
			return OP::DefaultIncrement();
		} else {
			auto data = (typename OP::INCREMENT_TYPE *)vdata[2].data;
			auto idx = vdata[2].sel->get_index(row_idx);
			return data[idx];
		}
	}